

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_reduction_mode
          (Impl *this,Value *state,VkSamplerReductionModeCreateInfo **out_info)

{
  VkSamplerReductionMode VVar1;
  VkSamplerReductionModeCreateInfo *pVVar2;
  Type this_00;
  VkSamplerReductionModeCreateInfo *info;
  VkSamplerReductionModeCreateInfo **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkSamplerReductionModeCreateInfo>(&this->allocator);
  *out_info = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"reductionMode");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->reductionMode = VVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sampler_reduction_mode(const Value &state,
						       VkSamplerReductionModeCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerReductionModeCreateInfo>();
	*out_info = info;

	info->reductionMode = static_cast<VkSamplerReductionMode>(state["reductionMode"].GetUint());

	return true;
}